

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void __thiscall
ft::deque<double,_ft::allocator<double>_>::~deque(deque<double,_ft::allocator<double>_> *this)

{
  pointer p;
  bool bVar1;
  size_type sVar2;
  ulong local_48;
  size_type i;
  iterator it;
  chunk_allocator chunk_alloc;
  deque<double,_ft::allocator<double>_> *this_local;
  
  allocator<double_*>::allocator((allocator<double_*> *)((long)&it.m_node + 7));
  dequeIterator<double,_32UL>::dequeIterator((dequeIterator<double,_32UL> *)&i,&this->m_start);
  while( true ) {
    bVar1 = operator!=((dequeIterator<double,_32UL> *)&i,&this->m_finish);
    if (!bVar1) break;
    allocator<double>::destroy
              ((allocator<double> *)&this->field_0x70,(pointer)it._vptr_dequeIterator);
    dequeIterator<double,_32UL>::operator++((dequeIterator<double,_32UL> *)&i);
  }
  dequeIterator<double,_32UL>::~dequeIterator((dequeIterator<double,_32UL> *)&i);
  for (local_48 = 0; local_48 < this->m_map_size; local_48 = local_48 + 1) {
    allocator<double_*>::destroy
              ((allocator<double_*> *)((long)&it.m_node + 7),this->m_map + local_48);
    p = this->m_map[local_48];
    sVar2 = chunk_size(this);
    allocator<double>::deallocate((allocator<double> *)&this->field_0x70,p,sVar2);
  }
  allocator<double_*>::deallocate
            ((allocator<double_*> *)((long)&it.m_node + 7),this->m_map,this->m_map_size);
  allocator<double_*>::~allocator((allocator<double_*> *)((long)&it.m_node + 7));
  allocator<double>::~allocator((allocator<double> *)&this->field_0x70);
  dequeIterator<double,_32UL>::~dequeIterator(&this->m_finish);
  dequeIterator<double,_32UL>::~dequeIterator(&this->m_start);
  return;
}

Assistant:

~deque() {
		chunk_allocator	chunk_alloc;

		for (iterator it = this->m_start; it != this->m_finish; ++it) {
			this->m_alloc.destroy(it.m_cur);
		}
		for (size_type i = 0; i < this->m_map_size; ++i) {
			chunk_alloc.destroy(this->m_map + i);
			this->m_alloc.deallocate(this->m_map[i], this->chunk_size());
		}
		chunk_alloc.deallocate(this->m_map, this->m_map_size);
	}